

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.h
# Opt level: O3

void absl::lts_20250127::strings_internal::Base64EscapeInternal<std::__cxx11::string>
               (uchar *src,size_t szsrc,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dest,
               bool do_padding,char *base64_chars)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = CalculateBase64EscapedLenInternal(szsrc,do_padding);
  std::__cxx11::string::resize((ulong)dest,(char)sVar1);
  sVar2 = Base64EscapeInternal
                    (src,szsrc,(dest->_M_dataplus)._M_p,dest->_M_string_length,base64_chars,
                     do_padding);
  if (sVar1 != sVar2) {
    __assert_fail("calc_escaped_size == escaped_len",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/escaping.h"
                  ,0x31,
                  "void absl::strings_internal::Base64EscapeInternal(const unsigned char *, size_t, String *, bool, const char *) [String = std::basic_string<char>]"
                 );
  }
  if (sVar1 <= dest->_M_string_length) {
    dest->_M_string_length = sVar1;
    (dest->_M_dataplus)._M_p[sVar1] = '\0';
    return;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",sVar1);
}

Assistant:

void Base64EscapeInternal(const unsigned char* src, size_t szsrc, String* dest,
                          bool do_padding, const char* base64_chars) {
  const size_t calc_escaped_size =
      CalculateBase64EscapedLenInternal(szsrc, do_padding);
  STLStringResizeUninitialized(dest, calc_escaped_size);

  const size_t escaped_len = Base64EscapeInternal(
      src, szsrc, &(*dest)[0], dest->size(), base64_chars, do_padding);
  assert(calc_escaped_size == escaped_len);
  dest->erase(escaped_len);
}